

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O2

void __thiscall
CumulativeCalProp::ttef_analyse_tasks
          (CumulativeCalProp *this,int begin,int end,
          list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *tasks,
          int *en_lift,vec<Lit> *expl)

{
  uint task;
  int dur_in;
  _List_node_base *p_Var1;
  int *piVar2;
  long lVar3;
  int iVar4;
  Lit LVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  IntVar *pIVar10;
  int iVar11;
  int dur_in_lb;
  int dur_in_ub;
  Lit local_90;
  int local_8c;
  int local_88;
  int local_84;
  IntVar *local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  int *local_58;
  ulong local_50;
  long local_48;
  vec<Lit> *local_40;
  _List_node_base *local_38;
  
  local_48 = (long)begin;
  local_60 = (ulong)(uint)begin;
  local_50 = (ulong)(uint)end;
  local_88 = begin;
  local_74 = end;
  local_58 = en_lift;
  local_40 = expl;
  local_38 = (_List_node_base *)tasks;
  while (iVar4 = local_74, iVar9 = local_88,
        p_Var1 = (((_List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                    *)&((_List_node_base *)tasks)->_M_next)->_M_impl)._M_node.super__List_node_base.
                 _M_next, p_Var1 != (_List_node_base *)tasks) {
    task = *(uint *)&p_Var1[1]._M_next;
    dur_in = *(int *)((long)&p_Var1[1]._M_next + 4);
    pIVar10 = (this->start).data[task];
    iVar7 = pIVar10->min0;
    iVar11 = pIVar10->max0;
    if (this->ttef_expl_deg == ED_LIFT) {
      local_90.x = 0;
      local_84 = 0;
      local_68 = *local_58;
      local_6c = ((this->usage).data[task]->min).v;
      local_70 = local_68 / local_6c;
      local_8c = iVar7;
      local_80 = pIVar10;
      local_64 = iVar11;
      iVar8 = ttef_analyse_tasks_left_shift(this,local_88,local_74,dur_in,task,local_70,&local_90.x)
      ;
      iVar9 = ttef_analyse_tasks_right_shift(this,iVar9,iVar4,dur_in,task,local_70,&local_84);
      LVar5.x = local_90.x;
      if (local_84 < local_90.x) {
        LVar5.x = local_84;
      }
      *local_58 = (LVar5.x - dur_in) * local_6c + local_68;
      pIVar10 = local_80;
      expl = local_40;
      iVar7 = local_8c;
      iVar11 = local_64;
    }
    else if (this->ttef_expl_deg == ED_NORMAL) {
      if (this->rho == 1) {
        lVar3 = (long)(this->taskCalendar).data[task];
        iVar9 = 0;
        for (uVar6 = local_60;
            (iVar4 = (int)uVar6,
            iVar9 < (this->workingPeriods[lVar3 + -1][dur_in + local_88] -
                    this->workingPeriods[lVar3 + -1][local_48]) + ((this->dur).data[task]->min).v &&
            (0 < iVar4)); uVar6 = uVar6 - 1) {
          iVar9 = iVar9 + (uint)(this->calendar[lVar3 + -1][uVar6 - 1] == 1);
        }
        iVar8 = this->est_2[(int)task];
        if (iVar4 < this->est_2[(int)task]) {
          iVar8 = iVar4;
        }
        iVar9 = this->lst_2[(int)task];
        local_8c = iVar7;
      }
      else {
        piVar2 = (this->taskCalendar).data;
        iVar9 = 0;
        for (uVar6 = local_60;
            (iVar4 = (int)uVar6, iVar9 < ((this->dur).data[task]->min).v - dur_in && (0 < iVar4));
            uVar6 = uVar6 - 1) {
          iVar9 = iVar9 + (uint)(this->calendar[(long)piVar2[task] + -1][uVar6 - 1] == 1);
        }
        iVar8 = 0;
        for (uVar6 = local_50; (iVar9 = (int)uVar6, iVar8 < dur_in && (0 < iVar9));
            uVar6 = uVar6 - 1) {
          iVar8 = iVar8 + (uint)(this->calendar[(long)piVar2[task] + -1][uVar6 - 1] == 1);
        }
        iVar8 = this->est_2[(int)task];
        if (iVar4 < this->est_2[(int)task]) {
          iVar8 = iVar4;
        }
        local_8c = iVar7;
        local_80 = pIVar10;
        if (iVar9 < this->lst_2[(int)task]) {
          iVar9 = this->lst_2[(int)task];
        }
      }
    }
    else {
      iVar8 = this->est_2[(int)task];
      iVar9 = this->lst_2[(int)task];
    }
    if (iVar7 < iVar8) {
      local_90 = getNegGeqLit(pIVar10,iVar8);
      vec<Lit>::push(expl,&local_90);
    }
    if (iVar9 < iVar11) {
      local_90 = getNegLeqLit((this->start).data[task],iVar9);
      vec<Lit>::push(expl,&local_90);
    }
    tasks = (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
            local_38;
    pIVar10 = (this->dur).data[task];
    iVar9 = (pIVar10->min).v;
    if (pIVar10->min0 < iVar9) {
      local_90 = getNegGeqLit(pIVar10,iVar9);
      vec<Lit>::push(expl,&local_90);
    }
    pIVar10 = (this->usage).data[task];
    iVar9 = (pIVar10->min).v;
    if (pIVar10->min0 < iVar9) {
      local_90 = getNegGeqLit(pIVar10,iVar9);
      vec<Lit>::push(expl,&local_90);
    }
    std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::
    pop_front(tasks);
  }
  return;
}

Assistant:

void CumulativeCalProp::ttef_analyse_tasks(const int begin, const int end,
																					 std::list<TaskDur>& tasks, int& en_lift,
																					 vec<Lit>& expl) {
	while (!tasks.empty()) {
		const int i = tasks.front().task;
		const int dur_in = tasks.front().dur_in;
		int expl_lb;
		int expl_ub;
		const int est0 = min_start0(i);
		const int lst0 = max_start0(i);
		// TTEF_cal: running variable for loops t, storages for execution times sto1 and sto2
		int t;
		int sto1;
		int sto2;
		// Calculate possible lifting
		// TTEF_cal: several changes were necessary
		switch (ttef_expl_deg) {
			case ED_NORMAL:
				// XXX Is min_dur correct
				if (rho == 1) {
					// Resource stays engaged
					sto1 = workingPeriods[taskCalendar[i] - 1][begin] -
								 workingPeriods[taskCalendar[i] - 1][begin + dur_in];
					sto2 = min_dur(i) - sto1;
					sto1 = 0;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					expl_ub = lst_2[i];  // max(lst_2[i], end - dur_in);
				} else {
					// Resource is released
					sto1 = 0;
					sto2 = min_dur(i) - dur_in;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					sto1 = 0;
					sto2 = dur_in;
					t = end;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_ub = std::max(lst_2[i], t);
				}
				// expl_lb = begin + dur_in - min_dur(i); expl_ub = end - dur_in;
				break;
			//-----------------------------------------------------------
			case ED_LIFT: {
				int dur_in_lb = 0;
				int dur_in_ub = 0;
				// Computing maximal lift for the work days inside the time window [begin, end)
				const int max_lift = en_lift / min_usage(i);
				// Computing the lifted lower and upper bound on the start time
				expl_lb = ttef_analyse_tasks_left_shift(begin, end, dur_in, i, max_lift, dur_in_lb);
				expl_ub = ttef_analyse_tasks_right_shift(begin, end, dur_in, i, max_lift, dur_in_ub);
				// Some consistency checks
				assert(dur_in - dur_in_lb <= max_lift);
				assert(dur_in - dur_in_ub <= max_lift);
				assert(ttef_analyse_tasks_check_expl_lb(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_lb));
				assert(ttef_analyse_tasks_check_expl_ub(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_ub));
				// Computing the used lift
				const int dur_lift = dur_in - std::min(dur_in_lb, dur_in_ub);
				// Updating the remaining energy for lifting
				en_lift -= min_usage(i) * dur_lift;
			} break;
			//-----------------------------------------------------------
			case ED_NAIVE:
			default:
				expl_lb = est_2[i];
				expl_ub = lst_2[i];
		}
		// printf("%d: dur_in %d/%d; en_in %d; est0 %d; lst0 %d\t", i, dur_in, dur[i], dur_in *
		// min_usage(i), est0, lst0);
		if (est0 < expl_lb) {
			// printf("s[%d] >= %d; ", i, expl_lb);
			expl.push(getNegGeqLit(start[i], expl_lb));
		}
		if (expl_ub < lst0) {
			// printf("s[%d] <= %d; ", i, expl_ub);
			expl.push(getNegLeqLit(start[i], expl_ub));
		}
		// Get the negated literal for [[dur[i] >= min_dur(i)]]
		if (min_dur0(i) < min_dur(i)) {
			expl.push(getNegGeqLit(dur[i], min_dur(i)));
		}
		// Get the negated literal for [[usage[i] >= min_usage(i)]]
		if (min_usage0(i) < min_usage(i)) {
			expl.push(getNegGeqLit(usage[i], min_usage(i)));
		}
		// printf("\n");
		tasks.pop_front();
	}
}